

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::javanano::EnumFieldGenerator::GenerateHashCodeCode
          (EnumFieldGenerator *this,Printer *printer)

{
  Params *pPVar1;
  char *text;
  
  io::Printer::Print(printer,"result = 31 * result + ");
  pPVar1 = (this->super_FieldGenerator).params_;
  if ((pPVar1->use_reference_types_for_primitives_ == true) &&
     (pPVar1->reftypes_primitive_enums_ != true)) {
    text = "(this.$name$ == null ? 0 : this.$name$)";
  }
  else {
    text = "this.$name$";
  }
  io::Printer::Print(printer,&this->variables_,text);
  io::Printer::Print(printer,";\n");
  return;
}

Assistant:

void EnumFieldGenerator::GenerateHashCodeCode(io::Printer* printer) const {
  printer->Print(
    "result = 31 * result + ");
  if (params_.use_reference_types_for_primitives()
        && !params_.reftypes_primitive_enums()) {
    printer->Print(variables_,
      "(this.$name$ == null ? 0 : this.$name$)");
  } else {
    printer->Print(variables_,
      "this.$name$");
  }
  printer->Print(";\n");
}